

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall TcpSocketImpl::SetSocketOption(TcpSocketImpl *this,int32_t *fd)

{
  undefined4 in_EAX;
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint32_t nSize;
  SOCKOPT rc;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = in_EAX;
  BaseSocketImpl::SetSocketOption(&this->super_BaseSocketImpl,fd);
  local_14 = 1;
  iVar1 = setsockopt(*fd,6,1,&local_14,4);
  if (iVar1 != -1) {
    local_18 = 0x100000;
    iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,1,7,&local_18,4);
    if (iVar1 != -1) {
      local_18 = 0x100000;
      iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,1,8,&local_18,4);
      if (iVar1 != -1) {
        return;
      }
    }
  }
  piVar2 = (int *)__cxa_allocate_exception(4);
  piVar3 = __errno_location();
  *piVar2 = *piVar3;
  __cxa_throw(piVar2,&int::typeinfo,0);
}

Assistant:

void TcpSocketImpl::SetSocketOption(const SOCKET& fd)
{
    BaseSocketImpl::SetSocketOption(fd);

    constexpr SOCKOPT rc = 1;
    if (::setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, &rc, sizeof(rc)) == -1)
        throw WSAGetLastError();

    uint32_t nSize = 0x100000;
    constexpr int iLen = sizeof(nSize);
    if (::setsockopt(m_fSock, SOL_SOCKET, SO_SNDBUF, reinterpret_cast<char*>(&nSize), iLen) == -1)
        throw WSAGetLastError();
    nSize = 0x100000;
    if (::setsockopt(m_fSock, SOL_SOCKET, SO_RCVBUF, reinterpret_cast<char*>(&nSize), iLen) == -1)
        throw WSAGetLastError();
}